

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SwapTeleFog
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  long lVar2;
  PClass *pPVar3;
  PClassActor *temp;
  PClass *pPVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    pPVar4 = (PClass *)puVar1[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar4;
    }
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar3 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      lVar2 = puVar1[0x85];
      if (lVar2 != puVar1[0x86]) {
        puVar1[0x85] = puVar1[0x86];
        puVar1[0x86] = lVar2;
      }
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x18e0,
                "int AF_AActor_A_SwapTeleFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SwapTeleFog)
{
	PARAM_SELF_PROLOGUE(AActor);
	if ((self->TeleFogSourceType != self->TeleFogDestType)) //Does nothing if they're the same.
	{
		PClassActor *temp = self->TeleFogSourceType;
		self->TeleFogSourceType = self->TeleFogDestType;
		self->TeleFogDestType = temp;
	}
	return 0;
}